

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_socket.cpp
# Opt level: O3

void __thiscall cppnet::ConnectSocket::Accept(ConnectSocket *this)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Atomic_word _Var6;
  Event *pEVar7;
  mapped_type *pmVar8;
  long *in_FS_OFFSET;
  bool bVar9;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  element_type *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  if (this->_accept_event == (Event *)0x0) {
    pEVar7 = (Event *)operator_new(0x28);
    pEVar7->_vptr_Event = (_func_int **)&PTR__Event_001271a0;
    pEVar7->_data = (void *)0x0;
    pEVar7->_event_type = 0;
    (pEVar7->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pEVar7->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this->_accept_event = pEVar7;
    std::__shared_ptr<cppnet::ConnectSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppnet::ConnectSocket,void>
              ((__shared_ptr<cppnet::ConnectSocket,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (__weak_ptr<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<cppnet::ConnectSocket>);
    peVar4 = local_48;
    local_30 = local_48;
    local_28._M_pi = p_Stack_40;
    local_48 = (element_type *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pEVar7->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pEVar7->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_28);
    if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
    }
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
  }
  std::__shared_ptr<cppnet::ConnectSocket,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppnet::ConnectSocket,void>
            ((__shared_ptr<cppnet::ConnectSocket,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             (__weak_ptr<cppnet::ConnectSocket,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<cppnet::ConnectSocket>);
  Socket::__all_socket_map::__tls_init();
  pmVar8 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)(*in_FS_OFFSET + -0x40),&(this->super_Socket)._sock);
  p_Var5 = p_Stack_40;
  peVar4 = local_48;
  local_48 = (element_type *)0x0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (pmVar8->super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (pmVar8->super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar4;
  (pmVar8->super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       p_Var5;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  p_Var2 = (this->super_Socket)._event_actions.
           super___weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var6 = p_Var2->_M_use_count;
    do {
      if (_Var6 == 0) {
        return;
      }
      LOCK();
      iVar1 = p_Var2->_M_use_count;
      bVar9 = _Var6 == iVar1;
      if (bVar9) {
        p_Var2->_M_use_count = _Var6 + 1;
        iVar1 = _Var6;
      }
      _Var6 = iVar1;
      UNLOCK();
    } while (!bVar9);
    peVar3 = (this->super_Socket)._event_actions.
             super___weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 != (element_type *)0x0 && p_Var2->_M_use_count != 0) {
      (*peVar3->_vptr_EventActions[6])(peVar3,this->_accept_event);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  return;
}

Assistant:

void ConnectSocket::Accept() {
    if (!_accept_event) {
        _accept_event = new Event();
        _accept_event->SetSocket(shared_from_this());
    }
    __all_socket_map[_sock] = shared_from_this();
    auto actions = GetEventActions();
    if (actions) {
        actions->AddAcceptEvent(_accept_event);
    }
}